

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorType::InternalSwap(TensorType *this,TensorType *other)

{
  TensorType *other_local;
  TensorType *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->dimensions_).super_RepeatedPtrFieldBase,
             &(other->dimensions_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::
  MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
  ::Swap(&this->attributes_,&other->attributes_);
  std::swap<long>(&this->rank_,&other->rank_);
  std::swap<int>(&this->datatype_,&other->datatype_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void TensorType::InternalSwap(TensorType* other) {
  dimensions_.InternalSwap(&other->dimensions_);
  attributes_.Swap(&other->attributes_);
  std::swap(rank_, other->rank_);
  std::swap(datatype_, other->datatype_);
  std::swap(_cached_size_, other->_cached_size_);
}